

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall project::get_export_formats_abi_cxx11_(project *this)

{
  bool bVar1;
  const_iterator pxVar2;
  char_t *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  xml_node_iterator xVar4;
  xml_node child;
  xml_node_iterator __end2;
  xml_node_iterator __begin2;
  xml_object_range<pugi::xml_node_iterator> *__range2;
  xpath_node node;
  const_iterator it;
  xpath_node_set xformats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  xpath_node *in_stack_fffffffffffffe98;
  xpath_node_set *in_stack_fffffffffffffea0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb0;
  xml_node in_stack_fffffffffffffed0;
  xpath_variable_set *in_stack_fffffffffffffee8;
  const_iterator pxVar5;
  char_t *in_stack_fffffffffffffef0;
  xml_node *in_stack_fffffffffffffef8;
  undefined1 local_e1 [33];
  xml_node local_c0;
  xml_node_iterator local_b8;
  xml_node_iterator local_a8;
  xml_node_struct *local_98;
  xml_object_range<pugi::xml_node_iterator> local_90;
  xml_object_range<pugi::xml_node_iterator> *local_70;
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  const_iterator local_58;
  xpath_node_set local_40;
  byte local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10849e);
  pugi::xml_node::select_nodes
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_58 = pugi::xpath_node_set::begin(&local_40);
  while( true ) {
    pxVar5 = local_58;
    pxVar2 = pugi::xpath_node_set::end(&local_40);
    if (pxVar5 == pxVar2) break;
    local_68 = (local_58->_node)._root;
    pxStack_60 = (local_58->_attribute)._attr;
    local_98 = (xml_node_struct *)pugi::xpath_node::node(in_stack_fffffffffffffe98);
    pugi::xml_node::children((xml_node *)in_stack_fffffffffffffed0._root);
    local_70 = &local_90;
    xVar4 = pugi::xml_object_range<pugi::xml_node_iterator>::begin(local_70);
    in_stack_fffffffffffffed0 = xVar4._parent._root;
    local_a8 = xVar4;
    xVar4 = pugi::xml_object_range<pugi::xml_node_iterator>::end(local_70);
    local_b8 = xVar4;
    while( true ) {
      bVar1 = pugi::xml_node_iterator::operator!=(&local_a8,&local_b8);
      if (!bVar1) break;
      in_stack_fffffffffffffeb0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pugi::xml_node_iterator::operator*(&local_a8);
      local_c0._root =
           (xml_node_struct *)
           (in_stack_fffffffffffffeb0->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pugi::xml_node::name(&local_c0);
      in_stack_fffffffffffffea0 = (xpath_node_set *)local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_e1 + 1),pcVar3,(allocator *)in_stack_fffffffffffffea0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
      std::__cxx11::string::~string((string *)(local_e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_e1);
      pugi::xml_node_iterator::operator++(&local_a8);
    }
    local_58 = local_58 + 1;
  }
  local_11 = 1;
  pugi::xpath_node_set::~xpath_node_set(in_stack_fffffffffffffea0);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffeb0);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> project::get_export_formats()
{
    std::vector<std::string> res;

    pugi::xpath_node_set xformats = m_Doc.select_nodes("/JUCERPROJECT/EXPORTFORMATS");

    for (pugi::xpath_node_set::const_iterator it = xformats.begin(); it != xformats.end(); ++it)
    {
        pugi::xpath_node node = *it;
        for (pugi::xml_node child: node.node().children())
        {
            res.push_back(child.name());
        }
    }

    return res;
}